

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O3

xmlChar * xmlSaveUri(xmlURIPtr uri)

{
  byte *pbVar1;
  xmlChar *pxVar2;
  xmlChar *pxVar3;
  xmlChar *pxVar4;
  xmlChar xVar5;
  char cVar6;
  byte bVar7;
  uint uVar8;
  byte *pbVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  int max;
  uint local_3c;
  xmlURIPtr local_38;
  
  if (uri == (xmlURIPtr)0x0) {
    return (xmlChar *)0x0;
  }
  local_3c = 0x50;
  pxVar2 = (xmlChar *)(*xmlMalloc)(0x51);
  iVar15 = 0;
  if (pxVar2 == (xmlChar *)0x0) {
    return (xmlChar *)0x0;
  }
  pxVar4 = (xmlChar *)uri->scheme;
  local_38 = uri;
  if (pxVar4 != (xmlChar *)0x0) {
    xVar5 = *pxVar4;
    if (xVar5 == '\0') {
      uVar16 = 0;
      pxVar3 = pxVar2;
      uVar8 = local_3c;
    }
    else {
      uVar13 = 0;
      do {
        pxVar3 = pxVar2;
        if ((long)(int)local_3c <= (long)uVar13) {
          if ((int)local_3c < 1) {
            uVar8 = 0x50;
          }
          else {
            if (0xfffff < local_3c) goto LAB_00154c73;
            uVar14 = local_3c + 1 >> 1;
            uVar8 = uVar14 + local_3c;
            if (0x100000 - uVar14 < local_3c) {
              uVar8 = 0x100000;
            }
          }
          pxVar3 = (xmlChar *)(*xmlRealloc)(pxVar2,(long)uVar8 + 1);
          if (pxVar3 == (xmlChar *)0x0) goto LAB_00154c73;
          xVar5 = pxVar4[uVar13];
          local_3c = uVar8;
        }
        uVar16 = uVar13 + 1;
        pxVar3[uVar13] = xVar5;
        xVar5 = pxVar4[uVar13 + 1];
        uVar13 = uVar16;
        pxVar2 = pxVar3;
      } while (xVar5 != '\0');
      uVar8 = local_3c;
      if ((int)local_3c <= (int)uVar16) {
        if ((int)local_3c < 1) {
          uVar8 = 0x50;
        }
        else {
          if (0xfffff < local_3c) goto LAB_00154c73;
          uVar14 = local_3c + 1 >> 1;
          uVar8 = uVar14 + local_3c;
          if (0x100000 - uVar14 < local_3c) {
            uVar8 = 0x100000;
          }
        }
        pxVar3 = (xmlChar *)(*xmlRealloc)(pxVar3,(long)uVar8 + 1);
        if (pxVar3 == (xmlChar *)0x0) goto LAB_00154c73;
      }
    }
    local_3c = uVar8;
    iVar15 = (int)uVar16 + 1;
    pxVar3[uVar16 & 0xffffffff] = ':';
    pxVar2 = pxVar3;
  }
  pbVar9 = (byte *)local_38->opaque;
  pxVar4 = pxVar2;
  if (pbVar9 == (byte *)0x0) {
    if ((local_38->server == (char *)0x0) && (local_38->port == 0)) {
      if (local_38->authority == (char *)0x0) {
        if (((local_38->scheme != (char *)0x0) && ((int)local_3c <= iVar15 + 3)) &&
           (pxVar4 = xmlSaveUriRealloc(pxVar2,(int *)&local_3c), pxVar4 == (xmlChar *)0x0))
        goto LAB_00154c73;
      }
      else {
        if (((int)local_3c <= iVar15 + 3) &&
           (pxVar4 = xmlSaveUriRealloc(pxVar2,(int *)&local_3c), pxVar4 == (xmlChar *)0x0))
        goto LAB_00154c73;
        (pxVar4 + iVar15)[0] = '/';
        (pxVar4 + iVar15)[1] = '/';
        bVar7 = *local_38->authority;
        pbVar9 = (byte *)local_38->authority;
        pxVar2 = pxVar4;
        iVar15 = iVar15 + 2;
        while (pxVar4 = pxVar2, bVar7 != 0) {
          iVar10 = iVar15 + 3;
          if ((int)local_3c <= iVar10) {
            if ((int)local_3c < 1) {
              uVar8 = 0x50;
            }
            else {
              if (0xfffff < local_3c) goto LAB_00154c73;
              uVar14 = local_3c + 1 >> 1;
              uVar8 = uVar14 + local_3c;
              if (0x100000 - uVar14 < local_3c) {
                uVar8 = 0x100000;
              }
            }
            pxVar4 = (xmlChar *)(*xmlRealloc)(pxVar2,(long)uVar8 + 1);
            if (pxVar4 == (xmlChar *)0x0) goto LAB_00154c73;
            bVar7 = *pbVar9;
            local_3c = uVar8;
          }
          if (((byte)(bVar7 - 0x30) < 10) || ((byte)((bVar7 & 0xdf) + 0xbf) < 0x1a)) {
LAB_00154aa5:
            iVar10 = iVar15 + 1;
            iVar11 = iVar15;
          }
          else {
            uVar8 = bVar7 - 0x21;
            if (((uVar8 < 0x3f) && ((0x4000000096003fe9U >> ((ulong)uVar8 & 0x3f) & 1) != 0)) ||
               (bVar7 == 0x7e)) goto LAB_00154aa5;
            pxVar4[iVar15] = '%';
            cVar6 = '0';
            if (0x9f < bVar7) {
              cVar6 = '7';
            }
            iVar11 = iVar15 + 2;
            pxVar4[(long)iVar15 + 1] = cVar6 + (bVar7 >> 4);
            cVar6 = '0';
            if (9 < (bVar7 & 0xf)) {
              cVar6 = '7';
            }
            bVar7 = cVar6 + (bVar7 & 0xf);
          }
          pxVar4[iVar11] = bVar7;
          bVar7 = pbVar9[1];
          pbVar9 = pbVar9 + 1;
          pxVar2 = pxVar4;
          iVar15 = iVar10;
        }
      }
    }
    else {
      uVar8 = local_3c;
      if ((int)local_3c <= iVar15 + 3) {
        if ((int)local_3c < 1) {
          uVar8 = 0x50;
        }
        else {
          if (0xfffff < local_3c) goto LAB_00154c73;
          uVar14 = local_3c + 1 >> 1;
          uVar8 = uVar14 + local_3c;
          if (0x100000 - uVar14 < local_3c) {
            uVar8 = 0x100000;
          }
        }
        pxVar4 = (xmlChar *)(*xmlRealloc)(pxVar2,(long)uVar8 + 1);
        if (pxVar4 == (xmlChar *)0x0) goto LAB_00154c73;
      }
      local_3c = uVar8;
      (pxVar4 + iVar15)[0] = '/';
      (pxVar4 + iVar15)[1] = '/';
      iVar15 = iVar15 + 2;
      pbVar9 = (byte *)local_38->user;
      if (pbVar9 != (byte *)0x0) {
        bVar7 = *pbVar9;
        iVar10 = iVar15;
        pxVar2 = pxVar4;
        while (bVar7 != 0) {
          iVar15 = iVar10 + 3;
          pxVar4 = pxVar2;
          if ((int)local_3c <= iVar15) {
            if ((int)local_3c < 1) {
              uVar8 = 0x50;
            }
            else {
              if (0xfffff < local_3c) goto LAB_00154c73;
              uVar14 = local_3c + 1 >> 1;
              uVar8 = uVar14 + local_3c;
              if (0x100000 - uVar14 < local_3c) {
                uVar8 = 0x100000;
              }
            }
            pxVar4 = (xmlChar *)(*xmlRealloc)(pxVar2,(long)uVar8 + 1);
            if (pxVar4 == (xmlChar *)0x0) goto LAB_00154c73;
            bVar7 = *pbVar9;
            local_3c = uVar8;
          }
          if (((byte)(bVar7 - 0x30) < 10) || ((byte)((bVar7 & 0xdf) + 0xbf) < 0x1a)) {
LAB_00154592:
            iVar15 = iVar10 + 1;
            iVar11 = iVar10;
          }
          else {
            uVar8 = bVar7 - 0x21;
            if (((uVar8 < 0x3f) && ((0x4000000016003fe9U >> ((ulong)uVar8 & 0x3f) & 1) != 0)) ||
               (bVar7 == 0x7e)) goto LAB_00154592;
            pxVar4[iVar10] = '%';
            cVar6 = '0';
            if (0x9f < bVar7) {
              cVar6 = '7';
            }
            iVar11 = iVar10 + 2;
            pxVar4[(long)iVar10 + 1] = cVar6 + (bVar7 >> 4);
            cVar6 = '0';
            if (9 < (bVar7 & 0xf)) {
              cVar6 = '7';
            }
            bVar7 = cVar6 + (bVar7 & 0xf);
          }
          pxVar4[iVar11] = bVar7;
          bVar7 = pbVar9[1];
          iVar10 = iVar15;
          pbVar9 = pbVar9 + 1;
          pxVar2 = pxVar4;
        }
        pxVar4 = pxVar2;
        if (((int)local_3c <= iVar10 + 3) &&
           (pxVar4 = xmlSaveUriRealloc(pxVar2,(int *)&local_3c), pxVar4 == (xmlChar *)0x0))
        goto LAB_00154c73;
        iVar15 = iVar10 + 1;
        pxVar4[iVar10] = '@';
      }
      pxVar3 = (xmlChar *)local_38->server;
      if ((pxVar3 != (xmlChar *)0x0) && (xVar5 = *pxVar3, xVar5 != '\0')) {
        lVar12 = (long)iVar15;
        pxVar2 = pxVar4;
        do {
          pxVar4 = pxVar2;
          if ((int)local_3c <= lVar12) {
            if ((int)local_3c < 1) {
              uVar8 = 0x50;
            }
            else {
              if (0xfffff < local_3c) goto LAB_00154c73;
              uVar14 = local_3c + 1 >> 1;
              uVar8 = uVar14 + local_3c;
              if (0x100000 - uVar14 < local_3c) {
                uVar8 = 0x100000;
              }
            }
            pxVar4 = (xmlChar *)(*xmlRealloc)(pxVar2,(long)uVar8 + 1);
            if (pxVar4 == (xmlChar *)0x0) goto LAB_00154c73;
            xVar5 = *pxVar3;
            local_3c = uVar8;
          }
          pxVar4[lVar12] = xVar5;
          lVar12 = lVar12 + 1;
          xVar5 = pxVar3[1];
          iVar15 = iVar15 + 1;
          pxVar2 = pxVar4;
          pxVar3 = pxVar3 + 1;
        } while (xVar5 != '\0');
      }
      uVar8 = local_38->port;
      if (0 < (int)uVar8) {
        pxVar3 = pxVar4;
        if ((int)local_3c <= iVar15 + 10) {
          pxVar3 = xmlSaveUriRealloc(pxVar4,(int *)&local_3c);
          pxVar2 = pxVar4;
          if (pxVar3 == (xmlChar *)0x0) goto LAB_00154c73;
          uVar8 = local_38->port;
        }
        iVar10 = snprintf((char *)(pxVar3 + iVar15),(long)(int)(local_3c - iVar15),":%d",
                          (ulong)uVar8);
        iVar15 = iVar10 + iVar15;
        pxVar4 = pxVar3;
      }
    }
    pbVar9 = (byte *)local_38->path;
    if (pbVar9 != (byte *)0x0) {
      if ((xmlChar *)local_38->scheme == (xmlChar *)0x0) {
LAB_00154791:
        bVar7 = *pbVar9;
      }
      else {
        bVar7 = *pbVar9;
        if (bVar7 == 0x2f) {
          if ((((byte)((pbVar9[1] & 0xdf) + 0xbf) < 0x1a) && (pbVar9[2] == 0x3a)) &&
             (iVar10 = xmlStrEqual((xmlChar *)local_38->scheme,(xmlChar *)"file"), iVar10 != 0)) {
            pxVar3 = pxVar4;
            if (((int)local_3c <= iVar15 + 3) &&
               (pxVar3 = xmlSaveUriRealloc(pxVar4,(int *)&local_3c), pxVar2 = pxVar4,
               pxVar3 == (xmlChar *)0x0)) goto LAB_00154c73;
            pxVar3[iVar15] = *pbVar9;
            pxVar3[(long)iVar15 + 1] = pbVar9[1];
            pbVar1 = pbVar9 + 2;
            pbVar9 = pbVar9 + 3;
            pxVar3[(long)iVar15 + 2] = *pbVar1;
            pxVar4 = pxVar3;
            iVar15 = iVar15 + 3;
          }
          goto LAB_00154791;
        }
      }
      while (bVar7 != 0) {
        iVar10 = iVar15 + 3;
        if ((int)local_3c <= iVar10) {
          pxVar2 = pxVar4;
          if ((int)local_3c < 1) {
            uVar8 = 0x50;
          }
          else {
            if (0xfffff < local_3c) goto LAB_00154c73;
            uVar14 = local_3c + 1 >> 1;
            uVar8 = uVar14 + local_3c;
            if (0x100000 - uVar14 < local_3c) {
              uVar8 = 0x100000;
            }
          }
          pxVar4 = (xmlChar *)(*xmlRealloc)(pxVar4,(long)uVar8 + 1);
          if (pxVar4 == (xmlChar *)0x0) goto LAB_00154c73;
          bVar7 = *pbVar9;
          local_3c = uVar8;
        }
        if (((byte)(bVar7 - 0x30) < 10) || ((byte)((bVar7 & 0xdf) + 0xbf) < 0x1a)) {
LAB_00154837:
          iVar10 = iVar15 + 1;
          iVar11 = iVar15;
        }
        else {
          uVar8 = bVar7 - 0x21;
          if (((uVar8 < 0x3f) && ((0x4000000094007fe9U >> ((ulong)uVar8 & 0x3f) & 1) != 0)) ||
             (bVar7 == 0x7e)) goto LAB_00154837;
          pxVar4[iVar15] = '%';
          cVar6 = '0';
          if (0x9f < bVar7) {
            cVar6 = '7';
          }
          iVar11 = iVar15 + 2;
          pxVar4[(long)iVar15 + 1] = cVar6 + (bVar7 >> 4);
          cVar6 = '0';
          if (9 < (bVar7 & 0xf)) {
            cVar6 = '7';
          }
          bVar7 = cVar6 + (bVar7 & 0xf);
        }
        pxVar4[iVar11] = bVar7;
        bVar7 = pbVar9[1];
        pbVar9 = pbVar9 + 1;
        iVar15 = iVar10;
      }
    }
    pxVar2 = pxVar4;
    if (local_38->query_raw == (char *)0x0) {
      if (local_38->query != (char *)0x0) {
        if (((int)local_3c <= iVar15 + 3) &&
           (pxVar4 = xmlSaveUriRealloc(pxVar4,(int *)&local_3c), pxVar4 == (xmlChar *)0x0))
        goto LAB_00154c73;
        iVar10 = iVar15 + 1;
        pxVar4[iVar15] = '?';
        pbVar9 = (byte *)local_38->query;
        bVar7 = *pbVar9;
        if (bVar7 == 0) goto LAB_00154c33;
        do {
          iVar15 = iVar10 + 3;
          if ((int)local_3c <= iVar15) {
            pxVar2 = pxVar4;
            if ((int)local_3c < 1) {
              uVar8 = 0x50;
            }
            else {
              if (0xfffff < local_3c) goto LAB_00154c73;
              uVar14 = local_3c + 1 >> 1;
              uVar8 = uVar14 + local_3c;
              if (0x100000 - uVar14 < local_3c) {
                uVar8 = 0x100000;
              }
            }
            pxVar4 = (xmlChar *)(*xmlRealloc)(pxVar4,(long)uVar8 + 1);
            if (pxVar4 == (xmlChar *)0x0) goto LAB_00154c73;
            bVar7 = *pbVar9;
            local_3c = uVar8;
          }
          if (((byte)(bVar7 - 0x30) < 10) || ((byte)((bVar7 & 0xdf) + 0xbf) < 0x1a)) {
LAB_00154bce:
            iVar15 = iVar10 + 1;
            iVar11 = iVar10;
          }
          else {
            uVar8 = bVar7 - 0x21;
            if (((uVar8 < 0x3f) && ((0x54000000d6007fe9U >> ((ulong)uVar8 & 0x3f) & 1) != 0)) ||
               (bVar7 == 0x7e)) goto LAB_00154bce;
            pxVar4[iVar10] = '%';
            cVar6 = '0';
            if (0x9f < bVar7) {
              cVar6 = '7';
            }
            iVar11 = iVar10 + 2;
            pxVar4[(long)iVar10 + 1] = cVar6 + (bVar7 >> 4);
            cVar6 = '0';
            if (9 < (bVar7 & 0xf)) {
              cVar6 = '7';
            }
            bVar7 = cVar6 + (bVar7 & 0xf);
          }
          pxVar4[iVar11] = bVar7;
          bVar7 = pbVar9[1];
          iVar10 = iVar15;
          pbVar9 = pbVar9 + 1;
        } while (bVar7 != 0);
      }
    }
    else {
      iVar10 = iVar15 + 1;
      if (((int)local_3c <= iVar10) &&
         (pxVar4 = xmlSaveUriRealloc(pxVar4,(int *)&local_3c), pxVar4 == (xmlChar *)0x0))
      goto LAB_00154c73;
      pxVar4[iVar15] = '?';
      xVar5 = *local_38->query_raw;
      if (xVar5 == '\0') {
LAB_00154c33:
        iVar15 = iVar15 + 1;
      }
      else {
        iVar15 = iVar10;
        pxVar3 = (xmlChar *)local_38->query_raw;
        lVar12 = (long)iVar10;
        do {
          if ((long)(int)local_3c <= lVar12 + 1) {
            pxVar2 = pxVar4;
            if ((int)local_3c < 1) {
              uVar8 = 0x50;
            }
            else {
              if (0xfffff < local_3c) goto LAB_00154c73;
              uVar14 = local_3c + 1 >> 1;
              uVar8 = uVar14 + local_3c;
              if (0x100000 - uVar14 < local_3c) {
                uVar8 = 0x100000;
              }
            }
            pxVar4 = (xmlChar *)(*xmlRealloc)(pxVar4,(long)uVar8 + 1);
            if (pxVar4 == (xmlChar *)0x0) goto LAB_00154c73;
            xVar5 = *pxVar3;
            local_3c = uVar8;
          }
          pxVar4[lVar12] = xVar5;
          xVar5 = pxVar3[1];
          iVar15 = iVar15 + 1;
          pxVar3 = pxVar3 + 1;
          lVar12 = lVar12 + 1;
        } while (xVar5 != '\0');
      }
    }
  }
  else {
    bVar7 = *pbVar9;
    while (bVar7 != 0) {
      iVar10 = iVar15 + 3;
      if ((int)local_3c <= iVar10) {
        pxVar2 = pxVar4;
        if ((int)local_3c < 1) {
          uVar8 = 0x50;
        }
        else {
          if (0xfffff < local_3c) goto LAB_00154c73;
          uVar14 = local_3c + 1 >> 1;
          uVar8 = uVar14 + local_3c;
          if (0x100000 - uVar14 < local_3c) {
            uVar8 = 0x100000;
          }
        }
        pxVar4 = (xmlChar *)(*xmlRealloc)(pxVar4,(long)uVar8 + 1);
        if (pxVar4 == (xmlChar *)0x0) goto LAB_00154c73;
        bVar7 = *pbVar9;
        local_3c = uVar8;
      }
      uVar8 = (uint)bVar7;
      if ((((((uVar8 - 0x24 < 0x3a) &&
             ((0x28000001ac00985U >> ((ulong)(uVar8 - 0x24) & 0x3f) & 1) != 0)) ||
            ((byte)(bVar7 - 0x30) < 10)) || ((byte)((bVar7 & 0xdf) + 0xbf) < 0x1a)) ||
          ((uVar8 - 0x21 < 0x3f &&
           ((0x40000000000033c1U >> ((ulong)(uVar8 - 0x21) & 0x3f) & 1) != 0)))) || (uVar8 == 0x7e))
      {
        iVar10 = iVar15 + 1;
        iVar11 = iVar15;
      }
      else {
        pxVar4[iVar15] = '%';
        cVar6 = '0';
        if (0x9f < bVar7) {
          cVar6 = '7';
        }
        iVar11 = iVar15 + 2;
        pxVar4[(long)iVar15 + 1] = cVar6 + (bVar7 >> 4);
        cVar6 = '0';
        if (9 < (bVar7 & 0xf)) {
          cVar6 = '7';
        }
        bVar7 = cVar6 + (bVar7 & 0xf);
      }
      pxVar4[iVar11] = bVar7;
      bVar7 = pbVar9[1];
      pbVar9 = pbVar9 + 1;
      iVar15 = iVar10;
    }
  }
  if (local_38->fragment != (char *)0x0) {
    uVar8 = local_3c;
    if ((int)local_3c <= iVar15 + 3) {
      pxVar2 = pxVar4;
      if ((int)local_3c < 1) {
        uVar8 = 0x50;
      }
      else {
        if (0xfffff < local_3c) goto LAB_00154c73;
        uVar14 = local_3c + 1 >> 1;
        uVar8 = uVar14 + local_3c;
        if (0x100000 - uVar14 < local_3c) {
          uVar8 = 0x100000;
        }
      }
      pxVar4 = (xmlChar *)(*xmlRealloc)(pxVar4,(long)uVar8 + 1);
      if (pxVar4 == (xmlChar *)0x0) goto LAB_00154c73;
    }
    local_3c = uVar8;
    pxVar4[iVar15] = '#';
    bVar7 = *local_38->fragment;
    iVar15 = iVar15 + 1;
    pbVar9 = (byte *)local_38->fragment;
    while (bVar7 != 0) {
      iVar10 = iVar15 + 3;
      if ((int)local_3c <= iVar10) {
        pxVar2 = pxVar4;
        if ((int)local_3c < 1) {
          uVar8 = 0x50;
        }
        else {
          if (0xfffff < local_3c) goto LAB_00154c73;
          uVar14 = local_3c + 1 >> 1;
          uVar8 = uVar14 + local_3c;
          if (0x100000 - uVar14 < local_3c) {
            uVar8 = 0x100000;
          }
        }
        pxVar4 = (xmlChar *)(*xmlRealloc)(pxVar4,(long)uVar8 + 1);
        if (pxVar4 == (xmlChar *)0x0) goto LAB_00154c73;
        bVar7 = *pbVar9;
        local_3c = uVar8;
      }
      if (((byte)(bVar7 - 0x30) < 10) || ((byte)((bVar7 & 0xdf) + 0xbf) < 0x1a)) {
LAB_001543f0:
        iVar10 = iVar15 + 1;
        iVar11 = iVar15;
      }
      else {
        uVar8 = bVar7 - 0x21;
        if (((uVar8 < 0x3f) && ((0x54000000d6007fe9U >> ((ulong)uVar8 & 0x3f) & 1) != 0)) ||
           (bVar7 == 0x7e)) goto LAB_001543f0;
        pxVar4[iVar15] = '%';
        cVar6 = '0';
        if (0x9f < bVar7) {
          cVar6 = '7';
        }
        iVar11 = iVar15 + 2;
        pxVar4[(long)iVar15 + 1] = cVar6 + (bVar7 >> 4);
        cVar6 = '0';
        if (9 < (bVar7 & 0xf)) {
          cVar6 = '7';
        }
        bVar7 = cVar6 + (bVar7 & 0xf);
      }
      pxVar4[iVar11] = bVar7;
      bVar7 = pbVar9[1];
      iVar15 = iVar10;
      pbVar9 = pbVar9 + 1;
    }
  }
  if ((int)local_3c <= iVar15) {
    pxVar2 = pxVar4;
    if ((int)local_3c < 1) {
      iVar10 = 0x51;
    }
    else {
      if (0xfffff < local_3c) goto LAB_00154c73;
      uVar8 = local_3c + 1 >> 1;
      iVar10 = 0x100001;
      if (local_3c <= 0x100000 - uVar8) {
        iVar10 = local_3c + 1 + uVar8;
      }
    }
    pxVar4 = (xmlChar *)(*xmlRealloc)(pxVar4,(size_t)iVar10);
    if (pxVar4 == (xmlChar *)0x0) {
LAB_00154c73:
      (*xmlFree)(pxVar2);
      return (xmlChar *)0x0;
    }
  }
  pxVar4[iVar15] = '\0';
  return pxVar4;
}

Assistant:

xmlChar *
xmlSaveUri(xmlURIPtr uri) {
    xmlChar *ret = NULL;
    xmlChar *temp;
    const char *p;
    int len;
    int max;

    if (uri == NULL) return(NULL);


    max = 80;
    ret = xmlMalloc(max + 1);
    if (ret == NULL)
	return(NULL);
    len = 0;

    if (uri->scheme != NULL) {
	p = uri->scheme;
	while (*p != 0) {
	    if (len >= max) {
                temp = xmlSaveUriRealloc(ret, &max);
                if (temp == NULL) goto mem_error;
		ret = temp;
	    }
	    ret[len++] = *p++;
	}
	if (len >= max) {
            temp = xmlSaveUriRealloc(ret, &max);
            if (temp == NULL) goto mem_error;
            ret = temp;
	}
	ret[len++] = ':';
    }
    if (uri->opaque != NULL) {
	p = uri->opaque;
	while (*p != 0) {
	    if (len + 3 >= max) {
                temp = xmlSaveUriRealloc(ret, &max);
                if (temp == NULL) goto mem_error;
                ret = temp;
	    }
	    if (IS_RESERVED(*(p)) || IS_UNRESERVED(*(p)))
		ret[len++] = *p++;
	    else {
		int val = *(unsigned char *)p++;
		int hi = val / 0x10, lo = val % 0x10;
		ret[len++] = '%';
		ret[len++] = hi + (hi > 9? 'A'-10 : '0');
		ret[len++] = lo + (lo > 9? 'A'-10 : '0');
	    }
	}
    } else {
	if ((uri->server != NULL) || (uri->port != PORT_EMPTY)) {
	    if (len + 3 >= max) {
                temp = xmlSaveUriRealloc(ret, &max);
                if (temp == NULL) goto mem_error;
                ret = temp;
	    }
	    ret[len++] = '/';
	    ret[len++] = '/';
	    if (uri->user != NULL) {
		p = uri->user;
		while (*p != 0) {
		    if (len + 3 >= max) {
                        temp = xmlSaveUriRealloc(ret, &max);
                        if (temp == NULL) goto mem_error;
                        ret = temp;
		    }
		    if ((IS_UNRESERVED(*(p))) ||
			((*(p) == ';')) || ((*(p) == ':')) ||
			((*(p) == '&')) || ((*(p) == '=')) ||
			((*(p) == '+')) || ((*(p) == '$')) ||
			((*(p) == ',')))
			ret[len++] = *p++;
		    else {
			int val = *(unsigned char *)p++;
			int hi = val / 0x10, lo = val % 0x10;
			ret[len++] = '%';
			ret[len++] = hi + (hi > 9? 'A'-10 : '0');
			ret[len++] = lo + (lo > 9? 'A'-10 : '0');
		    }
		}
		if (len + 3 >= max) {
                    temp = xmlSaveUriRealloc(ret, &max);
                    if (temp == NULL) goto mem_error;
                    ret = temp;
		}
		ret[len++] = '@';
	    }
	    if (uri->server != NULL) {
		p = uri->server;
		while (*p != 0) {
		    if (len >= max) {
			temp = xmlSaveUriRealloc(ret, &max);
			if (temp == NULL) goto mem_error;
			ret = temp;
		    }
                    /* TODO: escaping? */
		    ret[len++] = (xmlChar) *p++;
		}
	    }
            if (uri->port > 0) {
                if (len + 10 >= max) {
                    temp = xmlSaveUriRealloc(ret, &max);
                    if (temp == NULL) goto mem_error;
                    ret = temp;
                }
                len += snprintf((char *) &ret[len], max - len, ":%d", uri->port);
            }
	} else if (uri->authority != NULL) {
	    if (len + 3 >= max) {
                temp = xmlSaveUriRealloc(ret, &max);
                if (temp == NULL) goto mem_error;
                ret = temp;
	    }
	    ret[len++] = '/';
	    ret[len++] = '/';
	    p = uri->authority;
	    while (*p != 0) {
		if (len + 3 >= max) {
                    temp = xmlSaveUriRealloc(ret, &max);
                    if (temp == NULL) goto mem_error;
                    ret = temp;
		}
		if ((IS_UNRESERVED(*(p))) ||
                    ((*(p) == '$')) || ((*(p) == ',')) || ((*(p) == ';')) ||
                    ((*(p) == ':')) || ((*(p) == '@')) || ((*(p) == '&')) ||
                    ((*(p) == '=')) || ((*(p) == '+')))
		    ret[len++] = *p++;
		else {
		    int val = *(unsigned char *)p++;
		    int hi = val / 0x10, lo = val % 0x10;
		    ret[len++] = '%';
		    ret[len++] = hi + (hi > 9? 'A'-10 : '0');
		    ret[len++] = lo + (lo > 9? 'A'-10 : '0');
		}
	    }
	} else if (uri->scheme != NULL) {
	    if (len + 3 >= max) {
                temp = xmlSaveUriRealloc(ret, &max);
                if (temp == NULL) goto mem_error;
                ret = temp;
	    }
	}
	if (uri->path != NULL) {
	    p = uri->path;
	    /*
	     * the colon in file:///d: should not be escaped or
	     * Windows accesses fail later.
	     */
	    if ((uri->scheme != NULL) &&
		(p[0] == '/') &&
		(((p[1] >= 'a') && (p[1] <= 'z')) ||
		 ((p[1] >= 'A') && (p[1] <= 'Z'))) &&
		(p[2] == ':') &&
	        (xmlStrEqual(BAD_CAST uri->scheme, BAD_CAST "file"))) {
		if (len + 3 >= max) {
                    temp = xmlSaveUriRealloc(ret, &max);
                    if (temp == NULL) goto mem_error;
                    ret = temp;
		}
		ret[len++] = *p++;
		ret[len++] = *p++;
		ret[len++] = *p++;
	    }
	    while (*p != 0) {
		if (len + 3 >= max) {
                    temp = xmlSaveUriRealloc(ret, &max);
                    if (temp == NULL) goto mem_error;
                    ret = temp;
		}
		if ((IS_UNRESERVED(*(p))) || ((*(p) == '/')) ||
                    ((*(p) == ';')) || ((*(p) == '@')) || ((*(p) == '&')) ||
	            ((*(p) == '=')) || ((*(p) == '+')) || ((*(p) == '$')) ||
	            ((*(p) == ',')))
		    ret[len++] = *p++;
		else {
		    int val = *(unsigned char *)p++;
		    int hi = val / 0x10, lo = val % 0x10;
		    ret[len++] = '%';
		    ret[len++] = hi + (hi > 9? 'A'-10 : '0');
		    ret[len++] = lo + (lo > 9? 'A'-10 : '0');
		}
	    }
	}
	if (uri->query_raw != NULL) {
	    if (len + 1 >= max) {
                temp = xmlSaveUriRealloc(ret, &max);
                if (temp == NULL) goto mem_error;
                ret = temp;
	    }
	    ret[len++] = '?';
	    p = uri->query_raw;
	    while (*p != 0) {
		if (len + 1 >= max) {
                    temp = xmlSaveUriRealloc(ret, &max);
                    if (temp == NULL) goto mem_error;
                    ret = temp;
		}
		ret[len++] = *p++;
	    }
	} else if (uri->query != NULL) {
	    if (len + 3 >= max) {
                temp = xmlSaveUriRealloc(ret, &max);
                if (temp == NULL) goto mem_error;
                ret = temp;
	    }
	    ret[len++] = '?';
	    p = uri->query;
	    while (*p != 0) {
		if (len + 3 >= max) {
                    temp = xmlSaveUriRealloc(ret, &max);
                    if (temp == NULL) goto mem_error;
                    ret = temp;
		}
		if ((IS_UNRESERVED(*(p))) || (IS_RESERVED(*(p))))
		    ret[len++] = *p++;
		else {
		    int val = *(unsigned char *)p++;
		    int hi = val / 0x10, lo = val % 0x10;
		    ret[len++] = '%';
		    ret[len++] = hi + (hi > 9? 'A'-10 : '0');
		    ret[len++] = lo + (lo > 9? 'A'-10 : '0');
		}
	    }
	}
    }
    if (uri->fragment != NULL) {
	if (len + 3 >= max) {
            temp = xmlSaveUriRealloc(ret, &max);
            if (temp == NULL) goto mem_error;
            ret = temp;
	}
	ret[len++] = '#';
	p = uri->fragment;
	while (*p != 0) {
	    if (len + 3 >= max) {
                temp = xmlSaveUriRealloc(ret, &max);
                if (temp == NULL) goto mem_error;
                ret = temp;
	    }
	    if ((IS_UNRESERVED(*(p))) || (IS_RESERVED(*(p))))
		ret[len++] = *p++;
	    else {
		int val = *(unsigned char *)p++;
		int hi = val / 0x10, lo = val % 0x10;
		ret[len++] = '%';
		ret[len++] = hi + (hi > 9? 'A'-10 : '0');
		ret[len++] = lo + (lo > 9? 'A'-10 : '0');
	    }
	}
    }
    if (len >= max) {
        temp = xmlSaveUriRealloc(ret, &max);
        if (temp == NULL) goto mem_error;
        ret = temp;
    }
    ret[len] = 0;
    return(ret);

mem_error:
    xmlFree(ret);
    return(NULL);
}